

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O2

bool extreme_values_check(double param_1,double b)

{
  if (b <= 0.0) {
    std::operator<<((ostream *)&std::cerr," \n");
    std::operator<<((ostream *)&std::cerr,"EXTREME_VALUES_CHECK - Warning!\n");
    std::operator<<((ostream *)&std::cerr,"  B <= 0.\n");
  }
  return 0.0 < b;
}

Assistant:

bool extreme_values_check ( double /*a*/, double b )

//****************************************************************************80
//
//  Purpose:
//
//    EXTREME_VALUES_CHECK checks the parameters of the Extreme Values CDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    16 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double A, B, the parameters of the PDF.
//    0.0 < B.
//
//    Output, bool EXTREME_VALUES_CHECK, is true if the parameters are legal.
//
{
  if ( b <= 0.0 )
  {
    cerr << " \n";
    cerr << "EXTREME_VALUES_CHECK - Warning!\n";
    cerr << "  B <= 0.\n";
    return false;
  }

  return true;
}